

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifrso(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  voccxdef *vctx;
  int iVar2;
  runsdef *prVar3;
  char *ext;
  char buf [4096];
  
  prVar1 = ctx->bifcxrun;
  vctx = prVar1->runcxvoc;
  if (prVar1->runcxsp[-1].runstyp == '\x05') {
    iVar2 = os_paramfile(buf);
    if (iVar2 == 0) {
      runpnum(ctx->bifcxrun,6);
      return;
    }
  }
  else {
    prVar3 = prVar1->runcxsp + -1;
    prVar1->runcxsp = prVar3;
    if (prVar3->runstyp != '\x03') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    bifcstr(ctx,buf,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
    ext = "sav";
    if (ctx->bifcxsavext != (char *)0x0) {
      ext = ctx->bifcxsavext;
    }
    os_defext(buf,ext);
  }
  iVar2 = fiorso(vctx,buf);
  objulose(vctx->voccxundo);
  runpnum(ctx->bifcxrun,(long)iVar2);
  vctx->voccxflg = vctx->voccxflg | 1;
  return;
}

Assistant:

void bifrso(bifcxdef *ctx, int argc)
{
    uchar    *fn;
    char      buf[OSFNMAX];
    int       err;
    voccxdef *vctx = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 1, argc);
    
    /* check for special restore(nil) - restore game given as parameter */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        /* get filename from startup parameter, if any */
        if (!os_paramfile(buf))
        {
            /* no startup parameter */
            runpnum(ctx->bifcxrun, FIORSO_NO_PARAM_FILE);
            return;
        }
    }
    else
    {
        /* get string parameter - it's the filename */
        fn = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), fn);
        os_defext(buf, ctx->bifcxsavext != 0 ? ctx->bifcxsavext : "sav");
    }

    /* try restoring the file */
    err = fiorso(vctx, buf);

    /* blow away all undo records */
    objulose(vctx->voccxundo);

    /* return the result code from fiorso */
    runpnum(ctx->bifcxrun, err);

    /* note that the rest of the command line is to be ignored */
    vctx->voccxflg |= VOCCXFCLEAR;
}